

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

void Extra_Truth4VarN(unsigned_short **puCanons,char ***puPhases,char **ppCounters,int nPhasesMax)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  unsigned_short *__s;
  char *__s_00;
  char **__ptr;
  int local_54;
  int i;
  int nClasses;
  int nFuncs;
  char *pCounters;
  char **uPhases;
  uint uPhase;
  uint uTruth;
  unsigned_short *uCanons;
  int nPhasesMax_local;
  char **ppCounters_local;
  char ***puPhases_local;
  unsigned_short **puCanons_local;
  
  __s = (unsigned_short *)malloc(0x20000);
  memset(__s,0,0x20000);
  __s_00 = (char *)malloc(0x10000);
  memset(__s_00,0,0x10000);
  __ptr = (char **)Extra_ArrayAlloc(0x10000,nPhasesMax,1);
  uPhases._4_4_ = 0;
  do {
    if (0xffff < uPhases._4_4_) {
      if (puCanons == (unsigned_short **)0x0) {
        if (__s != (unsigned_short *)0x0) {
          free(__s);
        }
      }
      else {
        *puCanons = __s;
      }
      if (puPhases == (char ***)0x0) {
        if (__ptr != (char **)0x0) {
          free(__ptr);
        }
      }
      else {
        *puPhases = __ptr;
      }
      if (ppCounters == (char **)0x0) {
        if (__s_00 != (char *)0x0) {
          free(__s_00);
        }
      }
      else {
        *ppCounters = __s_00;
      }
      return;
    }
    if (__s[uPhases._4_4_] == 0) {
      for (local_54 = 0; local_54 < 0x10; local_54 = local_54 + 1) {
        uVar3 = Extra_TruthPolarize(uPhases._4_4_,local_54,4);
        if ((__s[uVar3] == 0) && ((uPhases._4_4_ != 0 || (local_54 == 0)))) {
          __s[uVar3] = (unsigned_short)uPhases._4_4_;
          *__ptr[uVar3] = (char)local_54;
          __s_00[uVar3] = '\x01';
        }
        else {
          if (__s[uVar3] != uPhases._4_4_) {
            __assert_fail("uCanons[uPhase] == uTruth",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilMisc.c"
                          ,0x350,"void Extra_Truth4VarN(unsigned short **, char ***, char **, int)")
            ;
          }
          if (__s_00[uVar3] < nPhasesMax) {
            pcVar2 = __ptr[uVar3];
            cVar1 = __s_00[uVar3];
            __s_00[uVar3] = cVar1 + '\x01';
            pcVar2[(int)cVar1] = (char)local_54;
          }
        }
      }
    }
    else if (uPhases._4_4_ <= __s[uPhases._4_4_]) {
      __assert_fail("uTruth > uCanons[uTruth]",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilMisc.c"
                    ,0x341,"void Extra_Truth4VarN(unsigned short **, char ***, char **, int)");
    }
    uPhases._4_4_ = uPhases._4_4_ + 1;
  } while( true );
}

Assistant:

void Extra_Truth4VarN( unsigned short ** puCanons, char *** puPhases, char ** ppCounters, int nPhasesMax )
{
    unsigned short * uCanons;
    unsigned uTruth, uPhase;
    char ** uPhases, * pCounters;
    int nFuncs, nClasses, i;

    nFuncs  = (1 << 16);
    uCanons = ABC_ALLOC( unsigned short, nFuncs );
    memset( uCanons, 0, sizeof(unsigned short) * nFuncs );
    pCounters = ABC_ALLOC( char, nFuncs );
    memset( pCounters, 0, sizeof(char) * nFuncs );
    uPhases = (char **)Extra_ArrayAlloc( nFuncs, nPhasesMax, sizeof(char) );
    nClasses = 0;
    for ( uTruth = 0; uTruth < (unsigned)nFuncs; uTruth++ )
    {
        // skip already assigned
        if ( uCanons[uTruth] )
        {
            assert( uTruth > uCanons[uTruth] );
            continue;
        }
        nClasses++;
        for ( i = 0; i < 16; i++ )
        {
            uPhase = Extra_TruthPolarize( uTruth, i, 4 );
            if ( uCanons[uPhase] == 0 && (uTruth || i==0) )
            {
                uCanons[uPhase]    = uTruth;
                uPhases[uPhase][0] = i;
                pCounters[uPhase]  = 1;
            }
            else
            {
                assert( uCanons[uPhase] == uTruth );
                if ( pCounters[uPhase] < nPhasesMax )
                    uPhases[uPhase][ (int)pCounters[uPhase]++ ] = i;
            }
        }
    }
    if ( puCanons ) 
        *puCanons = uCanons;
    else
        ABC_FREE( uCanons );
    if ( puPhases ) 
        *puPhases = uPhases;
    else
        ABC_FREE( uPhases );
    if ( ppCounters ) 
        *ppCounters = pCounters;
    else
        ABC_FREE( pCounters );
//    printf( "The number of 4N-classes = %d.\n", nClasses );
}